

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Kernel::Literal*>::loadFromIterator<Lib::VirtualIterator<Kernel::Literal*>>
          (Stack<Kernel::Literal*> *this,VirtualIterator<Kernel::Literal_*> *it)

{
  int iVar1;
  undefined4 extraout_var;
  
  while( true ) {
    iVar1 = (*it->_core->_vptr_IteratorCore[2])();
    if ((char)iVar1 == '\0') break;
    iVar1 = (*it->_core->_vptr_IteratorCore[3])();
    Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)this,(Literal *)CONCAT44(extraout_var,iVar1));
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }